

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O2

fasthessian * create_fast_hessian(integral_image *iimage)

{
  fasthessian *pfVar1;
  
  pfVar1 = (fasthessian *)malloc(0x60);
  pfVar1->iimage = iimage;
  pfVar1->octaves = 3;
  pfVar1->layers = 4;
  pfVar1->total_layers = 8;
  pfVar1->step = 2;
  pfVar1->thresh = 0.0004;
  return pfVar1;
}

Assistant:

struct fasthessian* create_fast_hessian(struct integral_image *iimage) {

    // malloc fast hessian struct
    struct fasthessian* fh = (struct fasthessian*) malloc(sizeof(struct fasthessian));

    // Integral Image
    fh->iimage = iimage;

    // Set Variables
    fh->octaves = NUM_OCTAVES;
    fh->layers = NUM_LAYERS;
    fh->total_layers = NUM_TOTAL_LAYERS;
    fh->step = INITIAL_STEP;
    fh->thresh = THRESHOLD;

    return fh;
}